

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder_internal.h
# Opt level: O2

void __thiscall basist::huffman_decoding_table::clear(huffman_decoding_table *this)

{
  basisu::clear_vector<basisu::vector<unsigned_char>>(&this->m_code_sizes);
  basisu::clear_vector<basisu::vector<int>>(&this->m_lookup);
  basisu::clear_vector<basisu::vector<short>>(&this->m_tree);
  return;
}

Assistant:

void clear()
		{
			basisu::clear_vector(m_code_sizes);
			basisu::clear_vector(m_lookup);
			basisu::clear_vector(m_tree);
		}